

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::iterate(CreateContextExtCase *this)

{
  EGLDisplay *ppvVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  EGLConfig config;
  EGLDisplay pvVar4;
  TestLog *log;
  NativeDisplay *pNVar5;
  qpTestResult testResult;
  CreateContextExtCase *pCVar6;
  bool bVar7;
  uint uVar8;
  deUint32 err;
  int iVar9;
  ostream *poVar10;
  eglu *this_00;
  _Rb_tree_node_base *p_Var11;
  Library *egl;
  NativePixmapFactory *pNVar12;
  EGLSurface pvVar13;
  undefined4 extraout_var;
  NativeWindowFactory *pNVar14;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *this_02;
  char *in_RCX;
  EGLint mask;
  EGLint flags;
  IterateResult IVar15;
  bool bVar16;
  int *piVar17;
  char *pcVar18;
  TestContext *this_03;
  allocator<char> local_3de;
  allocator<char> local_3dd;
  EGLint configId;
  CreateContextExtCase *local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  ScopedLogSection section;
  string local_3a8;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  UniqueSurface surface;
  ostringstream attribListString;
  
  iVar9 = this->m_iteration;
  if (iVar9 == 0) {
    piVar17 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_3d8 = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&attribListString);
    do {
      iVar9 = *piVar17;
      do {
        if (iVar9 == 0x3038) {
          std::operator<<(&attribListString.super_basic_ostream<char,_std::char_traits<char>_>,
                          "EGL_NONE");
          pCVar6 = local_3d8;
          surface.m_egl =
               (Library *)
               ((local_3d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          ppvVar1 = &surface.m_display;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::operator<<((ostream *)ppvVar1,"EGL attrib list: { ");
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)ppvVar1,(string *)&extensions);
          std::operator<<((ostream *)ppvVar1," }");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&surface,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&extensions);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&attribListString);
          attribListString.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
          attribListString.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
          attribListString.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
               &attribListString.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
          attribListString.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
          attribListString.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
               attribListString.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
          this_00 = (eglu *)EglTestContext::getLibrary((pCVar6->super_TestCase).m_eglTestCtx);
          eglu::getDisplayExtensions_abi_cxx11_
                    (&extensions,this_00,(Library *)pCVar6->m_display,in_RCX);
          piVar17 = (pCVar6->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00dd5565;
        }
        if (iVar9 == 0x31bd) {
          poVar10 = std::operator<<((ostream *)&attribListString,
                                    "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR, ");
          pcVar18 = "<Unknown>";
          if (piVar17[1] == 0x31bf) {
            pcVar18 = "EGL_LOSE_CONTEXT_ON_RESET_KHR";
          }
          in_RCX = "EGL_NO_RESET_NOTIFICATION_KHR";
          if (piVar17[1] == 0x31be) {
            pcVar18 = "EGL_NO_RESET_NOTIFICATION_KHR";
          }
          poVar10 = std::operator<<(poVar10,pcVar18);
          std::operator<<(poVar10,", ");
          goto LAB_00dd544f;
        }
        if (iVar9 == 0x30bf) {
          std::operator<<((ostream *)&attribListString,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ");
          uVar8 = piVar17[1];
          if (uVar8 < 2) {
            pcVar18 = "status == EGL_TRUE";
            if (uVar8 == 0) {
              pcVar18 = "status == EGL_FALSE";
            }
            std::operator<<((ostream *)&attribListString,pcVar18 + 10);
          }
          else {
            std::ostream::operator<<((ostringstream *)&attribListString,uVar8);
          }
          goto LAB_00dd544f;
        }
        if (iVar9 == 0x30fb) {
          poVar10 = std::operator<<((ostream *)&attribListString,"EGL_CONTEXT_MINOR_VERSION_KHR, ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,piVar17[1]);
          std::operator<<(poVar10,", ");
          goto LAB_00dd544f;
        }
        if (iVar9 == 0x30fc) {
          poVar10 = std::operator<<((ostream *)&attribListString,"EGL_CONTEXT_FLAGS_KHR, ");
          egl::(anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
                    ((string *)&surface,(_anonymous_namespace_ *)(ulong)(uint)piVar17[1],flags);
          poVar10 = std::operator<<(poVar10,(string *)&surface);
          std::operator<<(poVar10,", ");
LAB_00dd543d:
          std::__cxx11::string::~string((string *)&surface);
          goto LAB_00dd544f;
        }
        if (iVar9 == 0x30fd) {
          poVar10 = std::operator<<((ostream *)&attribListString,
                                    "EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR, ");
          egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                    ((string *)&surface,(_anonymous_namespace_ *)(ulong)(uint)piVar17[1],mask);
          poVar10 = std::operator<<(poVar10,(string *)&surface);
          std::operator<<(poVar10,", ");
          goto LAB_00dd543d;
        }
      } while (iVar9 != 0x3098);
      poVar10 = std::operator<<((ostream *)&attribListString,
                                "EGL_CONTEXT_MAJOR_VERSION_KHR(EGL_CONTEXT_CLIENT_VERSION), ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,piVar17[1]);
      std::operator<<(poVar10,", ");
LAB_00dd544f:
      piVar17 = piVar17 + 2;
    } while( true );
  }
  goto LAB_00dd575b;
LAB_00dd5565:
  do {
    iVar9 = *piVar17;
    if (iVar9 == 0x3098) {
LAB_00dd565c:
      piVar17 = piVar17 + 2;
      goto LAB_00dd5565;
    }
    if (iVar9 == 0x30bf) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_EXT_create_context_robustness",
                 (allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
LAB_00dd5654:
      std::__cxx11::string::~string((string *)&surface);
      goto LAB_00dd565c;
    }
    if (iVar9 == 0x30fb) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_KHR_create_context",(allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
      goto LAB_00dd5654;
    }
    if (iVar9 == 0x30fc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_KHR_create_context",(allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
      goto LAB_00dd5654;
    }
    if (iVar9 == 0x30fd) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_KHR_create_context",(allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
      goto LAB_00dd5654;
    }
    if (iVar9 == 0x3138) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_EXT_create_context_robustness",
                 (allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
      goto LAB_00dd5654;
    }
    if (iVar9 == 0x31bd) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,"EGL_KHR_create_context",(allocator<char> *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&attribListString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface);
      goto LAB_00dd5654;
    }
  } while (iVar9 != 0x3038);
  bVar16 = true;
  ppvVar1 = &surface.m_display;
  for (p_Var11 = (_Rb_tree_node_base *)
                 attribListString.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
      p_Var11 !=
      (_Rb_tree_node_base *)
      &attribListString.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    surface.m_egl =
         (Library *)
         extensions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3a8._M_dataplus._M_p =
         (pointer)extensions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&surface,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
    if (!bVar7) {
      surface.m_egl =
           (Library *)((local_3d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Required extension \'");
      std::operator<<((ostream *)ppvVar1,(string *)(p_Var11 + 1));
      std::operator<<((ostream *)ppvVar1,"\' not supported");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&surface,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      bVar16 = false;
    }
  }
  if (!bVar16) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Required extensions not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
               ,0x1b6);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extensions);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&attribListString);
  iVar9 = local_3d8->m_iteration;
  this = local_3d8;
LAB_00dd575b:
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (iVar9 < (int)((ulong)((long)ppvVar3 - (long)ppvVar2) >> 3)) {
    egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    config = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_iteration];
    uVar8 = eglu::getConfigAttribInt(egl,this->m_display,config,0x3033);
    configId = eglu::getConfigAttribInt(egl,this->m_display,config,0x3028);
    if ((uVar8 & 1) == 0) {
      if ((uVar8 & 4) == 0) {
        if ((uVar8 & 2) == 0) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"Invalid or empty surface type bits",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x39e);
          __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pNVar12 = eglu::selectNativePixmapFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        attribListString.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             (**(code **)(*(long *)pNVar12 + 0x20))
                       (pNVar12,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,this->m_display,config,0,0x100,0x100);
        pvVar4 = this->m_display;
        pvVar13 = eglu::createPixmapSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,
                             (NativePixmap *)
                             attribListString.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream,pvVar4,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface(&surface,egl,pvVar4,pvVar13);
        executeForSurface(this,config,surface.m_surface);
        eglu::UniqueSurface::~UniqueSurface(&surface);
        de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
        ~UniqueBase((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                    &attribListString);
      }
      else {
        pNVar14 = eglu::selectNativeWindowFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        pvVar4 = this->m_display;
        pNVar5 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                 super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
                 m_data.ptr;
        surface.m_display._0_4_ =
             eglu::parseWindowVisibility
                       (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine)
        ;
        surface.m_egl = (Library *)0x10000000100;
        iVar9 = (*(pNVar14->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                          (pNVar14,pNVar5,pvVar4,config);
        attribListString.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)CONCAT44(extraout_var_00,iVar9);
        pvVar4 = this->m_display;
        pvVar13 = eglu::createWindowSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,
                             (NativeWindow *)
                             attribListString.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream,pvVar4,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface(&surface,egl,pvVar4,pvVar13);
        executeForSurface(this,config,surface.m_surface);
        eglu::UniqueSurface::~UniqueSurface(&surface);
        de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
        ~UniqueBase((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                    &attribListString);
      }
    }
    else {
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      de::toString<int>(&local_3a8,&configId);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extensions,"EGLConfig ID: ",&local_3a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &attribListString,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extensions," with PBuffer");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&surface,
                 (char *)attribListString.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream,&local_3dd);
      de::toString<int>(&local_388,&configId);
      std::operator+(&local_368,"EGLConfig ID: ",&local_388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,local_368._M_dataplus._M_p,&local_3de);
      tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&surface,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&surface);
      std::__cxx11::string::~string((string *)&attribListString);
      std::__cxx11::string::~string((string *)&extensions);
      std::__cxx11::string::~string((string *)&local_3a8);
      attribListString.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x4000003057;
      attribListString.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x3056;
      attribListString.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x40;
      attribListString.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ = 0x3038;
      pvVar4 = this->m_display;
      iVar9 = (*egl->_vptr_Library[10])(egl,pvVar4,config,&attribListString);
      eglu::UniqueSurface::UniqueSurface
                (&surface,egl,pvVar4,(EGLSurface)CONCAT44(extraout_var,iVar9));
      err = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(err,"eglCreatePbufferSurface",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                       ,0x387);
      executeForSurface(this,config,surface.m_surface);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
    }
    this->m_iteration = this->m_iteration + 1;
    IVar15 = CONTINUE;
  }
  else {
    if (ppvVar3 == ppvVar2) {
      surface.m_egl =
           (Library *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppvVar1 = &surface.m_display;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"No supported configs found");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&surface,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar18 = "No supported configs found";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (this->m_isOk == true) {
        tcu::TestContext::setTestResult(this_03,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      pcVar18 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_03,testResult,pcVar18);
    IVar15 = STOP;
  }
  return IVar15;
}

Assistant:

TestCase::IterateResult CreateContextExtCase::iterate (void)
{
	if (m_iteration == 0)
	{
		logAttribList();
		checkRequiredExtensions();
	}

	if (m_iteration < (int)m_configs.size())
	{
		const Library&		egl				= m_eglTestCtx.getLibrary();
		const EGLConfig		config			= m_configs[m_iteration];
		const EGLint		surfaceTypes	= eglu::getConfigAttribInt(egl, m_display, config, EGL_SURFACE_TYPE);
		const EGLint		configId		= eglu::getConfigAttribInt(egl, m_display, config, EGL_CONFIG_ID);

		if ((surfaceTypes & EGL_PBUFFER_BIT) != 0)
		{
			tcu::ScopedLogSection	section			(m_testCtx.getLog(), ("EGLConfig ID: " + de::toString(configId) + " with PBuffer").c_str(), ("EGLConfig ID: " + de::toString(configId)).c_str());
			const EGLint			attribList[]	=
			{
				EGL_WIDTH,	64,
				EGL_HEIGHT,	64,
				EGL_NONE
			};
			eglu::UniqueSurface		surface			(egl, m_display, egl.createPbufferSurface(m_display, config, attribList));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_WINDOW_BIT) != 0)
		{
			const eglu::NativeWindowFactory&	factory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, eglu::WindowParams(256, 256, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_PIXMAP_BIT) != 0)
		{
			const eglu::NativePixmapFactory&	factory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativePixmap>	pixmap	(factory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, 256, 256));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else // No supported surface type
			TCU_FAIL("Invalid or empty surface type bits");

		m_iteration++;
		return CONTINUE;
	}
	else
	{
		if (m_configs.size() == 0)
		{
			m_testCtx.getLog() << TestLog::Message << "No supported configs found" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "No supported configs found");
		}
		else if (m_isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
}